

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

void set_max_size_cb(Fl_Button *param_1,void *v)

{
  bool bVar1;
  Fl_Widget_Type *pFVar2;
  int iVar3;
  Fl_Window_Type *win;
  Fl_Type *o;
  int mod;
  void *v_local;
  Fl_Button *param_0_local;
  
  if ((char *)v != "LOAD") {
    bVar1 = false;
    for (win = (Fl_Window_Type *)Fl_Type::first; win != (Fl_Window_Type *)0x0;
        win = (Fl_Window_Type *)(win->super_Fl_Widget_Type).super_Fl_Type.next) {
      if (((win->super_Fl_Widget_Type).super_Fl_Type.selected != '\0') &&
         (iVar3 = (*(win->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x21])(),
         pFVar2 = current_widget, iVar3 != 0)) {
        iVar3 = Fl_Widget::w(current_widget->o);
        *(int *)&pFVar2[1].super_Fl_Type.next = iVar3;
        iVar3 = Fl_Widget::h(pFVar2->o);
        *(int *)((long)&pFVar2[1].super_Fl_Type.next + 4) = iVar3;
        bVar1 = true;
      }
    }
    propagate_load(&the_panel->super_Fl_Group,"LOAD");
    if (bVar1) {
      set_modflag(1);
    }
  }
  return;
}

Assistant:

void set_max_size_cb(Fl_Button*, void* v) {
  if (v == LOAD) {
  } else {
    int mod = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_window()) {
        Fl_Window_Type *win = (Fl_Window_Type*)current_widget;
        win->sr_max_w = win->o->w();
        win->sr_max_h = win->o->h();
        mod = 1;
      }
    }
    propagate_load(the_panel, LOAD);
    if (mod) set_modflag(1);
  }
}